

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.h
# Opt level: O0

error __thiscall video::imm_format<29,49>(video *this,context *ctx,token *token,opcode *op)

{
  undefined8 this_00;
  bool bVar1;
  long lVar2;
  optional<unsigned_long> oVar3;
  int local_84;
  token local_80;
  string_view local_58;
  _Storage<unsigned_long,_true> local_48;
  undefined1 local_40;
  undefined1 local_38 [8];
  optional<long> result;
  opcode *op_local;
  token *token_local;
  context *ctx_local;
  
  result.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>._8_8_
       = op;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_58,".");
  oVar3 = find_in_table(token,imm_format<29,_49>::table,local_58);
  local_48._M_value =
       oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  local_40 = oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>._M_engaged;
  std::optional<long>::optional<unsigned_long,_true>
            ((optional<long> *)local_38,(optional<unsigned_long> *)&local_48);
  bVar1 = std::optional::operator_cast_to_bool((optional *)local_38);
  if (bVar1) {
    context::tokenize(&local_80,ctx);
    memcpy(token,&local_80,0x24);
  }
  this_00 = result.super__Optional_base<long,_true,_true>._M_payload.
            super__Optional_payload_base<long>._8_8_;
  local_84 = 1;
  lVar2 = std::optional<long>::value_or<int>((optional<long> *)local_38,&local_84);
  opcode::add_bits((opcode *)this_00,lVar2 << 0x31);
  memset(this,0,8);
  error::error((error *)this);
  return (unique_ptr<char[],_std::default_delete<char[]>_>)
         (unique_ptr<char[],_std::default_delete<char[]>_>)this;
}

Assistant:

DEFINE_OPERAND(imm_format)
    {
        static const char* table[] = {"U16", "S16", nullptr};
        std::optional<int64_t> result = find_in_table(token, table, ".");
        if (result) {
            token = ctx.tokenize();
        }
        op.add_bits(result.value_or(1) << sign_address);
        return {};
    }